

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junction.cpp
# Opt level: O1

void __thiscall Junction::convertUnits(Junction *this,Network *nw)

{
  list<Demand,_std::allocator<Demand>_> *plVar1;
  size_t *psVar2;
  double dVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  
  (this->super_Node).elev = (this->super_Node).elev / (nw->units).factors[1];
  (this->super_Node).initQual = (this->super_Node).initQual / (nw->units).factors[8];
  plVar1 = &this->demands;
  if ((this->demands).super__List_base<Demand,_std::allocator<Demand>_>._M_impl._M_node._M_size == 0
     ) {
    p_Var4 = (_List_node_base *)operator_new(0x28);
    p_Var5 = (_List_node_base *)(this->primaryDemand).fullDemand;
    p_Var4[1]._M_next = (_List_node_base *)(this->primaryDemand).baseDemand;
    p_Var4[1]._M_prev = p_Var5;
    p_Var4[2]._M_next = (_List_node_base *)(this->primaryDemand).timePattern;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar2 = &(this->demands).super__List_base<Demand,_std::allocator<Demand>_>._M_impl._M_node.
              _M_size;
    *psVar2 = *psVar2 + 1;
  }
  p_Var5 = (plVar1->super__List_base<Demand,_std::allocator<Demand>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)plVar1) {
    dVar3 = (nw->units).factors[5];
    do {
      p_Var5[1]._M_next = (_List_node_base *)((double)p_Var5[1]._M_next / dVar3);
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)plVar1);
  }
  if (this->emitter != (Emitter *)0x0) {
    Emitter::convertUnits(this->emitter,nw);
  }
  if ((this->pMin == -999999999.9) && (!NAN(this->pMin))) {
    this->pMin = (nw->options).valueOptions[3];
  }
  if ((this->pFull == -999999999.9) && (!NAN(this->pFull))) {
    this->pFull = (nw->options).valueOptions[4];
  }
  dVar3 = (nw->units).factors[4];
  this->pMin = this->pMin / dVar3;
  this->pFull = this->pFull / dVar3;
  return;
}

Assistant:

void Junction::convertUnits(Network* nw)
{
    // ... convert elevation & initial quality units

    elev /= nw->ucf(Units::LENGTH);
    initQual /= nw->ucf(Units::CONCEN);

    // ... if no demand categories exist, add primary demand to list

    if (demands.size() == 0) demands.push_back(primaryDemand);

    // ... convert flow units for base demand in each demand category

    double qcf = nw->ucf(Units::FLOW);
    for (Demand& demand : demands)
    {
        demand.baseDemand /= qcf;
    }

    // ... convert emitter flow units

    if (emitter) emitter->convertUnits(nw);

    // ... use global pressure limits if no local limits assigned

    if ( pMin == MISSING )  pMin = nw->option(Options::MINIMUM_PRESSURE);
    if ( pFull == MISSING ) pFull = nw->option(Options::SERVICE_PRESSURE);

    // ... convert units of pressure limits

    double pUcf = nw->ucf(Units::PRESSURE);
    pMin /= pUcf;
    pFull /= pUcf;
}